

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::push_back
          (SmallVector<std::function<void_()>,_0UL> *this,function<void_()> *t)

{
  size_t *psVar1;
  
  reserve(this,(this->super_VectorView<std::function<void_()>_>).buffer_size + 1);
  ::std::function<void_()>::function
            ((this->super_VectorView<std::function<void_()>_>).ptr +
             (this->super_VectorView<std::function<void_()>_>).buffer_size,t);
  psVar1 = &(this->super_VectorView<std::function<void_()>_>).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}